

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  uint uVar1;
  TString *pTVar2;
  
  if (l < 0x29) {
    pTVar2 = internshrstr(L,str,l);
    return pTVar2;
  }
  if (l < 0x7fffffffffffffcf) {
    uVar1 = L->l_G->seed;
    pTVar2 = (TString *)luaC_newobj(L,'\x14',l + 0x21);
    pTVar2->hash = uVar1;
    pTVar2->extra = '\0';
    pTVar2->shrlen = -1;
    (pTVar2->u).lnglen = l;
    pTVar2->contents = (char *)&pTVar2->falloc;
    *(undefined1 *)((long)&pTVar2->falloc + l) = 0;
    memcpy(pTVar2->contents,str,l);
    return pTVar2;
  }
  luaM_toobig(L);
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l_unlikely(l * sizeof(char) >= (MAX_SIZE - sizeof(TString))))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getlngstr(ts), str, l * sizeof(char));
    return ts;
  }
}